

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O2

TargetList *
Analyser::Static::Coleco::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  uchar uVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pSVar4;
  pointer puVar5;
  vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
  *pvVar6;
  bool bVar7;
  pointer puVar8;
  Cartridge *this;
  ulong uVar9;
  pointer psVar10;
  size_type __new_size;
  _Head_base<0UL,_Analyser::Static::Target_*,_false> local_a0;
  vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
  *local_98;
  Cartridge *local_90;
  vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  output_segments;
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> truncated_data;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  output_segments.
  super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(output_segments.
                         super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  local_98 = (vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
              *)__return_storage_ptr__;
  std::make_unique<Analyser::Static::Target,Analyser::Machine>((Machine *)&local_a0);
  (local_a0._M_head_impl)->confidence = 0.9999695;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar2 = (media->cartridges).
           super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (media->cartridges).
                 super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar2; psVar10 = psVar10 + 1
      ) {
    peVar3 = (psVar10->super___shared_ptr<Storage::Cartridge::Cartridge,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    pSVar4 = (peVar3->segments_).
             super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(peVar3->segments_).
              super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4 == 0x28) {
      puVar5 = *(pointer *)
                &(pSVar4->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      puVar8 = (pSVar4->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar9 = (long)puVar8 - (long)puVar5;
      puVar8 = puVar8 + -0x4000;
      if ((uVar9 & 0xffffffffffffe000) < 0x8001) {
        puVar8 = puVar5;
      }
      uVar1 = *puVar8;
      if (((((uVar1 == 'U') || (uVar1 == 0xaa)) || (puVar8[1] == 0xaa)) || (puVar8[1] == 'U')) &&
         (uVar1 != puVar8[1])) {
        output_segments.
        super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        output_segments.
        super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        output_segments.
        super__Vector_base<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ,&pSVar4->data);
        __new_size = (-(int)uVar9 & 0x1fff) + uVar9;
        if ((uVar9 & 0xfffffffffffffe00) == 0x8000) {
          __new_size = 0x8000;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ,__new_size);
        local_90 = (Cartridge *)CONCAT44(local_90._4_4_,0x8000);
        std::
        vector<Storage::Cartridge::Cartridge::Segment,std::allocator<Storage::Cartridge::Cartridge::Segment>>
        ::emplace_back<int,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                  ((vector<Storage::Cartridge::Cartridge::Segment,std::allocator<Storage::Cartridge::Cartridge::Segment>>
                    *)&output_segments,(int *)&local_90,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  );
        this = (Cartridge *)operator_new(0x20);
        Storage::Cartridge::Cartridge::Cartridge(this,&output_segments);
        local_90 = this;
        std::
        vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
        ::emplace_back<Storage::Cartridge::Cartridge*>
                  ((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
                    *)&local_68,&local_90);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&truncated_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  );
        std::
        vector<Storage::Cartridge::Cartridge::Segment,_std::allocator<Storage::Cartridge::Cartridge::Segment>_>
        ::~vector(&output_segments);
      }
    }
  }
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::_M_move_assign(&((local_a0._M_head_impl)->media).cartridges,&local_68);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_68);
  bVar7 = Media::empty(&(local_a0._M_head_impl)->media);
  pvVar6 = local_98;
  if (!bVar7) {
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              (local_98,(unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                         *)&local_a0);
  }
  if (local_a0._M_head_impl != (Target *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Target[1])();
  }
  return (TargetList *)pvVar6;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::Coleco::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	TargetList targets;
	auto target = std::make_unique<Target>(Machine::ColecoVision);
	target->confidence = 1.0f - 1.0f / 32768.0f;
	target->media.cartridges = ColecoCartridgesFrom(media.cartridges);
	if(!target->media.empty())
		targets.push_back(std::move(target));
	return targets;
}